

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcache.h
# Opt level: O3

QPixmapCacheEntry * __thiscall
QCache<QPixmapCache::Key,_QPixmapCacheEntry>::relink
          (QCache<QPixmapCache::Key,_QPixmapCacheEntry> *this,Key *key)

{
  Chain *pCVar1;
  Entry *pEVar2;
  Chain *pCVar3;
  Chain *pCVar4;
  QPixmapCacheEntry *pQVar5;
  ulong uVar6;
  Bucket BVar7;
  
  if ((this->d).size != 0) {
    BVar7 = QHashPrivate::Data<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node>::
            findBucket<QPixmapCache::Key>(&this->d,key);
    uVar6 = (ulong)(BVar7.span)->offsets[BVar7.index];
    if ((uVar6 == 0xff) || (pEVar2 = (BVar7.span)->entries, pEVar2 == (Entry *)0x0)) {
      pQVar5 = (QPixmapCacheEntry *)0x0;
    }
    else {
      pCVar1 = (Chain *)(pEVar2 + uVar6);
      if ((this->chain).next != pCVar1) {
        pCVar3 = pCVar1->prev;
        pCVar4 = pCVar1->next;
        pCVar3->next = pCVar4;
        pCVar4->prev = pCVar3;
        pCVar3 = (this->chain).next;
        pCVar1->next = pCVar3;
        pCVar3->prev = pCVar1;
        pCVar1->prev = &this->chain;
        (this->chain).next = pCVar1;
      }
      pQVar5 = (QPixmapCacheEntry *)pCVar1[1].next;
    }
    return pQVar5;
  }
  return (QPixmapCacheEntry *)0x0;
}

Assistant:

inline bool isEmpty() const noexcept { return !d.size; }